

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O0

void __thiscall leveldb::Iterator::~Iterator(Iterator *this)

{
  long lVar1;
  CleanupNode *pCVar2;
  bool bVar3;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  CleanupNode *next_node;
  CleanupNode *node;
  CleanupNode *in_stack_ffffffffffffffc8;
  CleanupNode *local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = &PTR__Iterator_01617d88;
  bVar3 = CleanupNode::IsEmpty(in_stack_ffffffffffffffc8);
  if (!bVar3) {
    CleanupNode::Run(in_stack_ffffffffffffffc8);
    pCVar2 = (CleanupNode *)in_RDI[4];
    while (local_18 = pCVar2, local_18 != (CleanupNode *)0x0) {
      CleanupNode::Run(in_stack_ffffffffffffffc8);
      pCVar2 = local_18->next;
      in_stack_ffffffffffffffc8 = local_18;
      if (local_18 != (CleanupNode *)0x0) {
        operator_delete(local_18,0x20);
        in_stack_ffffffffffffffc8 = local_18;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Iterator::~Iterator() {
  if (!cleanup_head_.IsEmpty()) {
    cleanup_head_.Run();
    for (CleanupNode* node = cleanup_head_.next; node != nullptr;) {
      node->Run();
      CleanupNode* next_node = node->next;
      delete node;
      node = next_node;
    }
  }
}